

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

QPoint __thiscall QWidget::mapFrom(QWidget *this,QWidget *parent,QPoint *pos)

{
  QPoint QVar1;
  long in_FS_OFFSET;
  QPointF local_28;
  QPointF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.xp = (qreal)(*pos).xp.m_i;
  local_28.yp = (qreal)(*pos).yp.m_i;
  local_18 = mapFrom(this,parent,&local_28);
  QVar1 = QPointF::toPoint(&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QPoint QWidget::mapFrom(const QWidget *parent, const QPoint &pos) const
{
    return mapFrom(parent, QPointF(pos)).toPoint();
}